

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_write_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  FILE *__s;
  size_t sVar1;
  uchar local_138 [8];
  uchar buf [256];
  FILE *f;
  int ret;
  char *path_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    ctx_local._4_4_ = -7;
  }
  else {
    f._4_4_ = mbedtls_hmac_drbg_random(ctx,local_138,0x100);
    if (f._4_4_ == 0) {
      sVar1 = fwrite(local_138,1,0x100,__s);
      if (sVar1 == 0x100) {
        f._4_4_ = 0;
      }
      else {
        f._4_4_ = -7;
      }
    }
    fclose(__s);
    mbedtls_platform_zeroize(local_138,0x100);
    ctx_local._4_4_ = f._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_write_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    FILE *f;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];

    if( ( f = fopen( path, "wb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    if( ( ret = mbedtls_hmac_drbg_random( ctx, buf, sizeof( buf ) ) ) != 0 )
        goto exit;

    if( fwrite( buf, 1, sizeof( buf ), f ) != sizeof( buf ) )
    {
        ret = MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR;
        goto exit;
    }

    ret = 0;

exit:
    fclose( f );
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( ret );
}